

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::setLogFile(CommonCore *this,string_view lfile)

{
  ActionMessage cmd;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  ActionMessage local_d0;
  
  local_e0._M_str = lfile._M_str;
  local_e0._M_len = lfile._M_len;
  ActionMessage::ActionMessage(&local_d0,cmd_core_configure);
  local_d0.dest_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  local_d0.messageID = 0x252;
  SmallBuffer::operator=(&local_d0.payload,&local_e0);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_d0);
  ActionMessage::~ActionMessage(&local_d0);
  return;
}

Assistant:

void CommonCore::setLogFile(std::string_view lfile)
{
    ActionMessage cmd(CMD_CORE_CONFIGURE);
    cmd.dest_id = global_id.load();
    cmd.messageID = UPDATE_LOGGING_FILE;
    cmd.payload = lfile;
    addActionMessage(cmd);
}